

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputComponentTest::getBufferDescriptors
          (XFBCaptureInactiveOutputComponentTest *this,GLuint param_1,Vector *out_descriptors)

{
  GLuint GVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  uint local_154;
  GLuint i;
  GLuint type_size;
  GLuint comp_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bulma_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bra_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *trunks_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vegeta_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *chichi_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goten_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *gohan_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goku_data;
  bufferDescriptor *xfb;
  bufferDescriptor *uniform;
  Type *type;
  Vector *out_descriptors_local;
  XFBCaptureInactiveOutputComponentTest *pXStack_10;
  GLuint param_1_local;
  XFBCaptureInactiveOutputComponentTest *this_local;
  
  uniform = (bufferDescriptor *)&Utils::Type::vec4;
  type = (Type *)out_descriptors;
  out_descriptors_local._4_4_ = param_1;
  pXStack_10 = this;
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize(out_descriptors,2);
  xfb = std::
        vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
        ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                      *)type,0);
  goku_data = &std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)type,1)->m_expected_data;
  xfb->m_index = 0;
  ((reference)goku_data)->m_index = 0;
  xfb->m_target = Uniform;
  ((reference)goku_data)->m_target = Transform_feedback;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data,
             (Type *)&Utils::Type::vec4);
  local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data;
  Utils::Type::GenerateData(&local_78,(Type *)&Utils::Type::vec4);
  local_60 = &local_78;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data,
             (Type *)&Utils::Type::vec4);
  local_90 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data,
             (Type *)&Utils::Type::vec4);
  local_b0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data,
             (Type *)&Utils::Type::vec4);
  local_d0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data,
             (Type *)&Utils::Type::vec4);
  local_f0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data,
             (Type *)&Utils::Type::vec4);
  local_110 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size,
             (Type *)&Utils::Type::vec4);
  local_130 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size;
  GVar1 = Utils::Type::GetTypeSize(Utils::Type::vec4);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_60);
  iVar2 = (int)sVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb->m_initial_data,(ulong)(uint)(iVar2 << 3));
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
  memcpy(pvVar4,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
  memcpy(pvVar4 + (sVar3 & 0xffffffff),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_90,0);
  memcpy(pvVar4 + (uint)(iVar2 * 2),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_b0,0);
  memcpy(pvVar4 + (uint)(iVar2 * 3),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d0,0);
  memcpy(pvVar4 + (uint)(iVar2 << 2),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_f0,0);
  memcpy(pvVar4 + (uint)(iVar2 * 5),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_110,0);
  memcpy(pvVar4 + (uint)(iVar2 * 6),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_130,0);
  memcpy(pvVar4 + (uint)(iVar2 * 7),pvVar5,sVar3 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (goku_data + 1,(ulong)(uint)(iVar2 << 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (goku_data,(ulong)(uint)(iVar2 << 3));
  for (local_154 = 0; local_154 < (uint)(iVar2 << 3); local_154 = local_154 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (goku_data + 1,(ulong)local_154);
    *pvVar4 = (value_type)local_154;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (goku_data,(ulong)local_154);
    *pvVar4 = (value_type)local_154;
  }
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
  memcpy(pvVar4 + (uint)(iVar2 << 1),pvVar5,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_40,0);
  memcpy(pvVar4 + (ulong)(GVar1 << 1) + (ulong)(uint)(iVar2 << 1),pvVar5 + (GVar1 << 1),(ulong)GVar1
        );
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
  memcpy(pvVar4 + GVar1,pvVar5 + GVar1,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
  memcpy(pvVar4 + GVar1 * 3,pvVar5 + GVar1 * 3,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_90,0);
  memcpy(pvVar4 + (sVar3 & 0xffffffff),pvVar5,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_90,0);
  memcpy(pvVar4 + (ulong)GVar1 + (sVar3 & 0xffffffff),pvVar5 + GVar1,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_b0,0);
  memcpy(pvVar4 + (ulong)(GVar1 << 1) + (ulong)(uint)(iVar2 * 3),pvVar5 + (GVar1 << 1),(ulong)GVar1)
  ;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_b0,0);
  memcpy(pvVar4 + (ulong)(GVar1 * 3) + (ulong)(uint)(iVar2 * 3),pvVar5 + GVar1 * 3,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_d0,0);
  memcpy(pvVar4 + (uint)(iVar2 * 7),pvVar5,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_f0,0);
  memcpy(pvVar4 + (ulong)GVar1 + (ulong)(uint)(iVar2 * 6),pvVar5 + GVar1,(ulong)GVar1);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_110,0);
  memcpy(pvVar4 + (ulong)(GVar1 << 1) + (ulong)(uint)(iVar2 * 5),pvVar5 + (GVar1 << 1),(ulong)GVar1)
  ;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_130,0);
  memcpy(pvVar4 + (ulong)(GVar1 * 3) + (ulong)(uint)(iVar2 << 2),pvVar5 + GVar1 * 3,(ulong)GVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bra_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&trunks_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chichi_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data);
  return;
}

Assistant:

void XFBCaptureInactiveOutputComponentTest::getBufferDescriptors(glw::GLuint /* test_case_index */,
																 bufferDescriptor::Vector& out_descriptors)
{
	const Utils::Type& type = Utils::Type::vec4;

	/* Test needs single uniform and xfb */
	out_descriptors.resize(2);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb	 = out_descriptors[1];

	/* Index */
	uniform.m_index = 0;
	xfb.m_index		= 0;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb.m_target	 = Utils::Buffer::Transform_feedback;

	/* Data */
	const std::vector<GLubyte>& goku_data   = type.GenerateData();
	const std::vector<GLubyte>& gohan_data  = type.GenerateData();
	const std::vector<GLubyte>& goten_data  = type.GenerateData();
	const std::vector<GLubyte>& chichi_data = type.GenerateData();
	const std::vector<GLubyte>& vegeta_data = type.GenerateData();
	const std::vector<GLubyte>& trunks_data = type.GenerateData();
	const std::vector<GLubyte>& bra_data	= type.GenerateData();
	const std::vector<GLubyte>& bulma_data  = type.GenerateData();

	const GLuint comp_size = Utils::Type::GetTypeSize(type.m_basic_type);
	const GLuint type_size = static_cast<GLuint>(gohan_data.size());

	/* Uniform data */
	uniform.m_initial_data.resize(8 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0 * type_size, &goku_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 1 * type_size, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 2 * type_size, &goten_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 3 * type_size, &chichi_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 4 * type_size, &vegeta_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 5 * type_size, &trunks_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 6 * type_size, &bra_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 7 * type_size, &bulma_data[0], type_size);

	/* XFB data */
	xfb.m_initial_data.resize(8 * type_size);
	xfb.m_expected_data.resize(8 * type_size);

	for (GLuint i = 0; i < 8 * type_size; ++i)
	{
		xfb.m_initial_data[i]  = (glw::GLubyte)i;
		xfb.m_expected_data[i] = (glw::GLubyte)i;
	}

	/* goku - x, z - 32 */
	memcpy(&xfb.m_expected_data[0] + 2 * type_size + 0 * comp_size, &goku_data[0] + 0 * comp_size, comp_size);
	memcpy(&xfb.m_expected_data[0] + 2 * type_size + 2 * comp_size, &goku_data[0] + 2 * comp_size, comp_size);

	/* gohan - y, w - 0 */
	memcpy(&xfb.m_expected_data[0] + 0 * type_size + 1 * comp_size, &gohan_data[0] + 1 * comp_size, comp_size);
	memcpy(&xfb.m_expected_data[0] + 0 * type_size + 3 * comp_size, &gohan_data[0] + 3 * comp_size, comp_size);

	/* goten - x, y - 16 */
	memcpy(&xfb.m_expected_data[0] + 1 * type_size + 0 * comp_size, &goten_data[0] + 0 * comp_size, comp_size);
	memcpy(&xfb.m_expected_data[0] + 1 * type_size + 1 * comp_size, &goten_data[0] + 1 * comp_size, comp_size);

	/* chichi - z, w - 48 */
	memcpy(&xfb.m_expected_data[0] + 3 * type_size + 2 * comp_size, &chichi_data[0] + 2 * comp_size, comp_size);
	memcpy(&xfb.m_expected_data[0] + 3 * type_size + 3 * comp_size, &chichi_data[0] + 3 * comp_size, comp_size);

	/* vegeta - x - 112 */
	memcpy(&xfb.m_expected_data[0] + 7 * type_size + 0 * comp_size, &vegeta_data[0] + 0 * comp_size, comp_size);

	/* trunks - y - 96 */
	memcpy(&xfb.m_expected_data[0] + 6 * type_size + 1 * comp_size, &trunks_data[0] + 1 * comp_size, comp_size);

	/* bra - z - 80 */
	memcpy(&xfb.m_expected_data[0] + 5 * type_size + 2 * comp_size, &bra_data[0] + 2 * comp_size, comp_size);

	/* bulma - w - 64 */
	memcpy(&xfb.m_expected_data[0] + 4 * type_size + 3 * comp_size, &bulma_data[0] + 3 * comp_size, comp_size);
}